

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O3

int x86MOV(uchar *stream,x86Size size,x86Reg index,int multiplier,x86Reg base,int shift,x86Reg src)

{
  uchar *puVar1;
  byte bVar2;
  uint uVar3;
  x86Reg index_00;
  byte *stream_00;
  bool bVar4;
  
  bVar4 = base == rNONE;
  if ((multiplier == 1 && bVar4) && index != rNONE) {
    base = index;
  }
  index_00 = rNONE;
  if ((multiplier != 1 || !bVar4) || index == rNONE) {
    index_00 = index;
  }
  if (size == sWORD) {
    *stream = 'f';
    if ((src == rEAX) && (index_00 == rNONE && base == rNONE)) {
      stream[1] = 0xa3;
      *(int *)(stream + 2) = shift;
      return 6;
    }
    bVar2 = 8 < (int)base | (8 < (int)index_00) * '\x02' | (8 < (int)src) << 2;
    bVar4 = bVar2 != 0;
    if (bVar4) {
      stream[1] = bVar2 | 0x40;
    }
    stream_00 = stream + 1 + (ulong)bVar4 + 1;
    stream[(ulong)bVar4 + 1] = 0x89;
  }
  else if (size == sBYTE) {
    if ((src == rEAX) && (index_00 == rNONE && base == rNONE)) {
      *stream = 0xa2;
      *(int *)(stream + 1) = shift;
      return 5;
    }
    bVar2 = 8 < (int)base | (8 < (int)index_00) * '\x02' | (8 < (int)src) << 2 | (4 < (int)src) << 3
    ;
    if (bVar2 != 0) {
      *stream = bVar2 | 0x40;
    }
    stream_00 = stream + (bVar2 != 0) + 1;
    stream[bVar2 != 0] = 0x88;
  }
  else {
    bVar2 = 8 < (int)base |
            (8 < (int)index_00) * '\x02' | (8 < (int)src) << 2 | (size == sQWORD) << 3;
    bVar4 = bVar2 != 0;
    if (bVar4) {
      *stream = bVar2 | 0x40;
    }
    puVar1 = stream + bVar4;
    if ((src == rEAX) && (index_00 == rNONE && base == rNONE)) {
      *puVar1 = 0xa3;
      *(int *)(puVar1 + 1) = shift;
      return ((int)puVar1 - (int)stream) + 5;
    }
    stream_00 = stream + (ulong)bVar4 + 1;
    *puVar1 = 0x89;
  }
  uVar3 = encodeAddress(stream_00,index_00,multiplier,base,shift,(int)regCode[src]);
  return ((int)stream_00 + uVar3) - (int)stream;
}

Assistant:

int x86MOV(unsigned char *stream, x86Size size, x86Reg index, int multiplier, x86Reg base, int shift, x86Reg src)
{
	unsigned char *start = stream;

	if(base == rNONE && index != rNONE && multiplier == 1)	// swap so if there is only one register, it will be base
	{
		base = index;
		index = rNONE;
	}

	if(size == sBYTE)
	{
		if(src == rEAX && index == rNONE && base == rNONE)
		{
			*stream++ = 0xa2;
			stream += encodeImmDword(stream, shift);

			return int(stream - start);
		}

		// To address byte register after dl, REX prefix is required, on x86 this is not possible at all
		stream += encodeRex(stream, src > rEDX, src, index, base);
		*stream++ = 0x88;
		stream += encodeAddress(stream, index, multiplier, base, shift, regCode[src]);

		return int(stream - start);
	}
	else if(size == sWORD)
	{
		*stream++ = 0x66;	// switch to word

		if(src == rEAX && index == rNONE && base == rNONE)
		{
			*stream++ = 0xa3;
			stream += encodeImmDword(stream, shift);

			return int(stream - start);
		}

		stream += encodeRex(stream, false, src, index, base);
		*stream++ = 0x89;
		stream += encodeAddress(stream, index, multiplier, base, shift, regCode[src]);

		return int(stream - start);
	}

	stream += encodeRex(stream, size == sQWORD, src, index, base);

	if(src == rEAX && index == rNONE && base == rNONE)
	{
		*stream++ = 0xa3;
		stream += encodeImmDword(stream, shift);

		return int(stream - start);
	}

	*stream++ = 0x89;
	stream += encodeAddress(stream, index, multiplier, base, shift, regCode[src]);

	return int(stream - start);
}